

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subset.hpp
# Opt level: O1

bool ut11::Operands::IsIterableContainingSubset<std::vector<int,std::allocator<int>>>::
     CompareListsAndRemoveFirstDuplicate<std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>,std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>
               (list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *a,list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *b)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  _List_node_base *p_Var4;
  
  p_Var2 = (a->
           super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  do {
    bVar3 = p_Var2 != (_List_node_base *)a;
    p_Var4 = (_List_node_base *)b;
    if (!bVar3) {
      return bVar3;
    }
    do {
      p_Var4 = (((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)p_Var4)->
               super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)b) goto LAB_001fe688;
    } while (*(int *)&(p_Var2[1]._M_next)->_M_next != *(int *)p_Var4[1]._M_next);
    psVar1 = &(a->
              super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
    psVar1 = &(b->
              super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var4);
    if (p_Var4 != (_List_node_base *)b) {
      return bVar3;
    }
LAB_001fe688:
    p_Var2 = (((_List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

static bool CompareListsAndRemoveFirstDuplicate(A& a, B& b)
			{
				for(auto i = a.begin(); i != a.end(); ++i)
					for(auto j = b.begin(); j != b.end(); ++j)
						if ( utility::AreEqual(**i, **j) )
						{
							a.erase(i);
							b.erase(j);
							return true;
						}

				return false;
			}